

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_nil(FuncState *fs,int from,int n)

{
  uint *puVar1;
  int pto;
  int pfrom;
  Instruction *previous;
  int n_local;
  int from_local;
  FuncState *fs_local;
  
  if (fs->lasttarget < fs->pc) {
    if (fs->pc == 0) {
      if ((int)(uint)fs->nactvar <= from) {
        return;
      }
    }
    else {
      puVar1 = fs->f->code + (fs->pc + -1);
      if ((((*puVar1 & 0x3f) == 3) && ((int)(*puVar1 >> 6 & 0xff) <= from)) &&
         (from <= (int)((*puVar1 >> 0x17) + 1))) {
        if (from + n + -1 <= (int)(*puVar1 >> 0x17)) {
          return;
        }
        *puVar1 = *puVar1 & 0x7fffff | (from + n + -1) * 0x800000;
        return;
      }
    }
  }
  luaK_codeABC(fs,OP_LOADNIL,from,from + n + -1,0);
  return;
}

Assistant:

static void luaK_nil(FuncState*fs,int from,int n){
Instruction*previous;
if(fs->pc>fs->lasttarget){
if(fs->pc==0){
if(from>=fs->nactvar)
return;
}
else{
previous=&fs->f->code[fs->pc-1];
if(GET_OPCODE(*previous)==OP_LOADNIL){
int pfrom=GETARG_A(*previous);
int pto=GETARG_B(*previous);
if(pfrom<=from&&from<=pto+1){
if(from+n-1>pto)
SETARG_B(*previous,from+n-1);
return;
}
}
}
}
luaK_codeABC(fs,OP_LOADNIL,from,from+n-1,0);
}